

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  seq_t sequence;
  seq_t sequence_00;
  ZSTD_DCtx *pZVar8;
  U32 i;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  BYTE *oend;
  long lVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  size_t srcSize_00;
  ulong uVar22;
  size_t sVar23;
  BYTE *pBVar24;
  uint uVar25;
  BYTE *litLimit;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong *puVar29;
  BYTE *pBVar30;
  ulong uVar31;
  BYTE *pBVar32;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [8];
  ZSTD_longOffset_e in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  ulong local_1d0;
  ulong local_1c8;
  BYTE *local_1b8;
  uint local_1b0;
  uint local_1ac;
  BIT_DStream_t local_1a8;
  ZSTD_fseState local_180;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  ulong local_150 [3];
  BYTE *local_138;
  ulong local_130;
  BYTE *local_128;
  BYTE *local_120;
  BYTE *local_118;
  ulong local_110;
  ZSTD_DCtx *local_108;
  uint local_fc;
  ulong local_f8;
  size_t local_f0;
  ulong local_e8 [23];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  local_108 = dctx;
  sVar11 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  srcSize_00 = srcSize - sVar11;
  iVar10 = local_108->ddictIsCold;
  local_128 = (BYTE *)dst;
  sVar12 = ZSTD_decodeSeqHeaders(local_108,(int *)&local_fc,(void *)(sVar11 + (long)src),srcSize_00)
  ;
  pZVar8 = local_108;
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  if (local_128 == (BYTE *)0x0 && 0 < (int)local_fc) {
    return 0xffffffffffffffba;
  }
  puVar29 = (ulong *)((long)(sVar11 + (long)src) + sVar12);
  sVar11 = srcSize_00 - sVar12;
  if (iVar10 == 0) {
    if (frame == 0) {
      if (8 < (int)local_fc) goto LAB_00715b49;
    }
    else if (0x1000000 < (local_108->fParams).windowSize && 8 < (int)local_fc) {
LAB_00715b49:
      iVar10 = 0;
      uVar9 = 1;
      do {
        iVar10 = (iVar10 + 1) -
                 (uint)(local_108->OFTptr[(ulong)(uVar9 - 1) + 1].nbAdditionalBits < 0x17);
        bVar15 = (byte)local_108->OFTptr->baseValue;
        uVar27 = uVar9 >> (bVar15 & 0x1f);
        uVar9 = uVar9 + 1;
      } while (uVar27 == 0);
      local_108->ddictIsCold = 0;
      if ((uint)(iVar10 << (8 - bVar15 & 0x1f)) < 7) goto LAB_00715c06;
      goto LAB_00715a70;
    }
    local_108->ddictIsCold = 0;
LAB_00715c06:
    sVar11 = ZSTD_decompressSequences
                       (local_108,local_128,dstCapacity,puVar29,sVar11,local_fc,
                        in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
    return sVar11;
  }
  local_108->ddictIsCold = 0;
LAB_00715a70:
  oend = local_128 + dstCapacity;
  local_1b8 = local_108->litPtr;
  litLimit = local_1b8 + local_108->litSize;
  pBVar24 = local_128;
  if (local_fc == 0) {
LAB_007169ee:
    pBVar6 = local_128;
    uVar26 = (long)litLimit - (long)local_1b8;
    sVar11 = 0xffffffffffffffba;
    if (uVar26 <= (ulong)((long)oend - (long)pBVar24)) {
      if (pBVar24 == (BYTE *)0x0) {
        pBVar24 = (BYTE *)0x0;
      }
      else {
        memcpy(pBVar24,local_1b8,uVar26);
        pBVar24 = pBVar24 + uVar26;
      }
      sVar11 = (long)pBVar24 - (long)pBVar6;
    }
  }
  else {
    pBVar6 = (BYTE *)local_108->prefixStart;
    local_120 = (BYTE *)local_108->virtualStart;
    local_138 = (BYTE *)local_108->dictEnd;
    local_108->fseEntropy = 1;
    lVar19 = -0xc;
    do {
      *(ulong *)((long)&local_138 + lVar19 * 2) =
           (ulong)*(uint *)((long)(local_108->entropy).workspace + lVar19);
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0);
    local_1ac = 8;
    if ((int)local_fc < 8) {
      local_1ac = local_fc;
    }
    if (srcSize_00 != sVar12) {
      local_1a8.limitPtr = (char *)(puVar29 + 1);
      if (sVar11 < 8) {
        local_1a8.bitContainer = (size_t)(byte)*puVar29;
        switch(sVar11) {
        case 7:
          local_1a8.bitContainer =
               local_1a8.bitContainer | (ulong)*(byte *)((long)puVar29 + 6) << 0x30;
        case 6:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)puVar29 + 5) << 0x28);
        case 5:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)puVar29 + 4) << 0x20);
        case 4:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)puVar29 + 3) * 0x1000000;
        case 3:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)puVar29 + 2) * 0x10000;
        case 2:
          local_1a8.bitContainer =
               (ulong)*(byte *)((long)puVar29 + 1) * 0x100 + local_1a8.bitContainer;
        }
        bVar15 = *(byte *)((long)src + (srcSize - 1));
        if (bVar15 != 0) {
          uVar9 = 0x1f;
          if (bVar15 != 0) {
            for (; bVar15 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          local_1a8.bitsConsumed = (uVar9 ^ 0x1f) + (int)sVar11 * -8 + 0x29;
          local_1a8.ptr = (char *)puVar29;
LAB_00715cb8:
          uVar22 = (long)local_128 - (long)pBVar6;
          local_1a8.start = (char *)puVar29;
          ZSTD_initFseState(&local_180,&local_1a8,local_108->LLTptr);
          ZSTD_initFseState(&local_170,&local_1a8,pZVar8->OFTptr);
          ZSTD_initFseState(&local_160,&local_1a8,pZVar8->MLTptr);
          uVar26 = (ulong)local_1a8.bitsConsumed;
          uVar14 = 0;
          if (local_1a8.bitsConsumed < 0x41) {
            uVar13 = 0;
            uVar14 = 0;
            if (0 < (int)local_1ac) {
              uVar14 = (ulong)local_1ac;
            }
            puVar29 = local_e8;
            do {
              uVar31 = local_150[1];
              if (local_1a8.ptr < local_1a8.limitPtr) {
                if (local_1a8.ptr != local_1a8.start) {
                  uVar28 = (ulong)(uint)((int)local_1a8.ptr - (int)local_1a8.start);
                  if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (uVar26 >> 3))) {
                    uVar28 = uVar26 >> 3;
                  }
                  local_1a8.bitsConsumed = (uint)uVar26 + (int)uVar28 * -8;
                  goto LAB_00715dac;
                }
              }
              else {
                uVar28 = uVar26 >> 3;
                local_1a8.bitsConsumed = (uint)uVar26 & 7;
LAB_00715dac:
                local_1a8.ptr = (char *)((long)local_1a8.ptr - uVar28);
                uVar26 = (ulong)local_1a8.bitsConsumed;
                local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
              }
              uVar9 = (uint)uVar26;
              if (uVar14 == uVar13) goto LAB_00716097;
              local_130 = uVar22;
              uVar3 = local_180.table[local_180.state].nextState;
              bVar15 = local_180.table[local_180.state].nbAdditionalBits;
              local_118 = (BYTE *)CONCAT44(local_118._4_4_,
                                           (uint)local_180.table[local_180.state].nbBits);
              uVar28 = (ulong)local_180.table[local_180.state].baseValue;
              local_110 = (ulong)local_160.table[local_160.state].nextState;
              bVar18 = local_160.table[local_160.state].nbAdditionalBits;
              local_1c8 = (ulong)local_160.table[local_160.state].baseValue;
              uVar4 = local_170.table[local_170.state].nextState;
              bVar1 = local_170.table[local_170.state].nbAdditionalBits;
              bVar2 = local_170.table[local_170.state].nbBits;
              if (bVar1 < 2) {
                if (bVar1 == 0) {
                  if (uVar28 == 0) {
                    local_150[1] = local_150[0];
                    goto LAB_00715e88;
                  }
                }
                else {
                  uVar9 = uVar9 + 1;
                  lVar19 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar28 == 0))
                           - ((long)(local_1a8.bitContainer << ((byte)uVar26 & 0x3f)) >> 0x3f);
                  if (lVar19 == 3) {
                    uVar26 = (local_150[0] - 1) + (ulong)(local_150[0] == 1);
LAB_00716054:
                    local_150[2] = local_150[1];
                  }
                  else {
                    uVar26 = local_150[lVar19] + (ulong)(local_150[lVar19] == 0);
                    if (lVar19 != 1) goto LAB_00716054;
                  }
                  local_150[1] = local_150[0];
                  local_150[0] = uVar26;
                  local_1a8.bitsConsumed = uVar9;
                }
              }
              else {
                uVar9 = uVar9 + bVar1;
                local_150[1] = local_150[0];
                local_150[2] = uVar31;
                uVar31 = ((local_1a8.bitContainer << ((byte)uVar26 & 0x3f)) >> (-bVar1 & 0x3f)) +
                         (ulong)local_170.table[local_170.state].baseValue;
                local_1a8.bitsConsumed = uVar9;
LAB_00715e88:
                local_150[1] = local_150[0];
                local_150[0] = uVar31;
              }
              uVar31 = local_150[0];
              if (bVar18 != 0) {
                bVar16 = (byte)uVar9;
                uVar9 = uVar9 + bVar18;
                local_1c8 = local_1c8 +
                            ((local_1a8.bitContainer << (bVar16 & 0x3f)) >> (-bVar18 & 0x3f));
                local_1a8.bitsConsumed = uVar9;
              }
              uVar27 = (uint)local_160.table[local_160.state].nbBits;
              if (0x1e < (byte)(bVar18 + bVar15 + bVar1)) {
                local_1b0 = (uint)local_160.table[local_160.state].nbBits;
                BIT_reloadDStream(&local_1a8);
                uVar27 = local_1b0;
                uVar9 = local_1a8.bitsConsumed;
              }
              if (bVar15 != 0) {
                bVar18 = (byte)uVar9;
                uVar9 = uVar9 + bVar15;
                uVar28 = uVar28 + ((local_1a8.bitContainer << (bVar18 & 0x3f)) >> (-bVar15 & 0x3f));
              }
              local_180.state =
                   (ulong)((uint)(local_1a8.bitContainer >>
                                 (-(char)(uVar9 + (int)local_118) & 0x3fU)) &
                          BIT_mask[(ulong)local_118 & 0xffffffff]) + (ulong)uVar3;
              iVar10 = uVar9 + (int)local_118 + uVar27;
              local_160.state =
                   ((uint)(local_1a8.bitContainer >> (-(char)iVar10 & 0x3fU)) & BIT_mask[uVar27]) +
                   local_110;
              local_1a8.bitsConsumed = iVar10 + (uint)bVar2;
              uVar26 = (ulong)local_1a8.bitsConsumed;
              local_170.state =
                   (ulong)((uint)(local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU))
                          & BIT_mask[(uint)bVar2]) + (ulong)uVar4;
              uVar22 = local_130 + uVar28 + local_1c8;
              puVar29[-2] = uVar28;
              puVar29[-1] = local_1c8;
              *puVar29 = uVar31;
              uVar13 = uVar13 + 1;
              puVar29 = puVar29 + 3;
            } while (local_1a8.bitsConsumed < 0x41);
            uVar14 = uVar13 & 0xffffffff;
          }
          if ((int)local_1ac <= (int)uVar14) {
LAB_00716097:
            local_118 = oend + -0x20;
            pBVar24 = local_128;
            while( true ) {
              uVar13 = local_150[1];
              uVar9 = (uint)uVar26;
              uVar27 = (uint)uVar14;
              if (0x40 < uVar9) break;
              if (local_1a8.ptr < local_1a8.limitPtr) {
                if (local_1a8.ptr != local_1a8.start) {
                  uVar14 = (ulong)(uint)((int)local_1a8.ptr - (int)local_1a8.start);
                  if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (uVar26 >> 3))) {
                    uVar14 = uVar26 >> 3;
                  }
                  uVar9 = uVar9 + (int)uVar14 * -8;
                  goto LAB_0071611c;
                }
              }
              else {
                uVar14 = uVar26 >> 3;
                uVar9 = uVar9 & 7;
LAB_0071611c:
                local_1a8.ptr = (char *)((long)local_1a8.ptr - uVar14);
                local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
                local_1a8.bitsConsumed = uVar9;
              }
              if ((int)local_fc <= (int)uVar27) goto LAB_007166f8;
              local_130 = uVar22;
              uVar3 = local_180.table[local_180.state].nextState;
              bVar15 = local_180.table[local_180.state].nbAdditionalBits;
              local_1c8 = (ulong)local_180.table[local_180.state].baseValue;
              uVar4 = local_160.table[local_160.state].nextState;
              bVar18 = local_160.table[local_160.state].nbAdditionalBits;
              bVar1 = local_160.table[local_160.state].nbBits;
              local_110 = (ulong)local_160.table[local_160.state].baseValue;
              uVar5 = local_170.table[local_170.state].nextState;
              bVar2 = local_170.table[local_170.state].nbAdditionalBits;
              bVar16 = local_170.table[local_170.state].nbBits;
              bVar17 = (byte)uVar9;
              if (bVar2 < 2) {
                if (bVar2 == 0) {
                  if (local_1c8 == 0) {
                    local_150[1] = local_150[0];
                    local_150[0] = uVar13;
                  }
                }
                else {
                  uVar9 = uVar9 + 1;
                  lVar19 = (ulong)(local_170.table[local_170.state].baseValue +
                                  (uint)(local_1c8 == 0)) -
                           ((long)(local_1a8.bitContainer << (bVar17 & 0x3f)) >> 0x3f);
                  if (lVar19 == 3) {
                    local_1d0 = (local_150[0] - 1) + (ulong)(local_150[0] == 1);
LAB_00716667:
                    local_150[2] = local_150[1];
                  }
                  else {
                    local_1d0 = local_150[lVar19] + (ulong)(local_150[lVar19] == 0);
                    if (lVar19 != 1) goto LAB_00716667;
                  }
                  local_150[1] = local_150[0];
                  local_150[0] = local_1d0;
                  local_1a8.bitsConsumed = uVar9;
                }
              }
              else {
                uVar9 = uVar9 + bVar2;
                local_150[1] = local_150[0];
                local_150[2] = uVar13;
                local_150[0] = ((local_1a8.bitContainer << (bVar17 & 0x3f)) >> (-bVar2 & 0x3f)) +
                               (ulong)local_170.table[local_170.state].baseValue;
                local_1a8.bitsConsumed = uVar9;
              }
              uVar26 = local_150[0];
              if (bVar18 != 0) {
                bVar17 = (byte)uVar9;
                uVar9 = uVar9 + bVar18;
                local_110 = (ulong)local_160.table[local_160.state].baseValue +
                            ((local_1a8.bitContainer << (bVar17 & 0x3f)) >> (-bVar18 & 0x3f));
                local_1a8.bitsConsumed = uVar9;
              }
              uVar25 = (uint)local_180.table[local_180.state].nbBits;
              if (0x1e < (byte)(bVar18 + bVar15 + bVar2)) {
                local_1b0 = (uint)local_180.table[local_180.state].nbBits;
                BIT_reloadDStream(&local_1a8);
                uVar25 = local_1b0;
                uVar9 = local_1a8.bitsConsumed;
              }
              if (bVar15 != 0) {
                bVar18 = (byte)uVar9;
                uVar9 = uVar9 + bVar15;
                local_1c8 = local_1c8 +
                            ((local_1a8.bitContainer << (bVar18 & 0x3f)) >> (-bVar15 & 0x3f));
              }
              iVar10 = uVar9 + uVar25 + (uint)bVar1;
              local_180.state =
                   (ulong)((uint)(local_1a8.bitContainer >> (-(char)(uVar9 + uVar25) & 0x3fU)) &
                          BIT_mask[uVar25]) + (ulong)uVar3;
              local_1a8.bitsConsumed = iVar10 + (uint)bVar16;
              local_160.state =
                   (ulong)((uint)(local_1a8.bitContainer >> (-(char)iVar10 & 0x3fU)) &
                          BIT_mask[(uint)bVar1]) + (ulong)uVar4;
              local_170.state =
                   (ulong)((uint)(local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU))
                          & BIT_mask[(uint)bVar16]) + (ulong)uVar5;
              uVar14 = (ulong)(uVar27 & 7);
              puVar29 = &local_f8 + uVar14 * 3;
              uVar22 = *puVar29;
              pBVar21 = local_1b8 + uVar22;
              if (litLimit < pBVar21) {
LAB_0071649e:
                sequence.matchLength._0_4_ = (int)(&local_f0)[uVar14 * 3];
                sequence.litLength = *puVar29;
                sequence.matchLength._4_4_ = (int)((&local_f0)[uVar14 * 3] >> 0x20);
                sequence.offset = local_e8[uVar14 * 3];
                uVar13 = ZSTD_execSequenceEnd
                                   (pBVar24,oend,sequence,&local_1b8,litLimit,pBVar6,local_120,
                                    local_138);
              }
              else {
                sVar23 = (&local_f0)[uVar14 * 3];
                uVar13 = uVar22 + sVar23;
                if (local_118 < pBVar24 + uVar13) goto LAB_0071649e;
                uVar31 = local_e8[uVar14 * 3];
                pBVar30 = pBVar24 + uVar22;
                uVar7 = *(undefined8 *)(local_1b8 + 8);
                *(undefined8 *)pBVar24 = *(undefined8 *)local_1b8;
                *(undefined8 *)(pBVar24 + 8) = uVar7;
                if (0x10 < uVar22) {
                  ZSTD_decompressBlock_internal_cold_1();
                }
                pBVar32 = pBVar30 + -uVar31;
                local_1b8 = pBVar21;
                if ((ulong)((long)pBVar30 - (long)pBVar6) < uVar31) {
                  if ((ulong)((long)pBVar30 - (long)local_120) < uVar31) goto LAB_00715b07;
                  lVar19 = (long)pBVar32 - (long)pBVar6;
                  pBVar21 = local_138 + lVar19;
                  if (local_138 < pBVar21 + sVar23) {
                    memmove(pBVar30,pBVar21,-lVar19);
                    pBVar30 = pBVar30 + -lVar19;
                    sVar23 = sVar23 + lVar19;
                    pBVar32 = pBVar6;
                    goto LAB_007163d2;
                  }
                  memmove(pBVar30,pBVar21,sVar23);
                }
                else {
LAB_007163d2:
                  if (uVar31 < 0x10) {
                    if (uVar31 < 8) {
                      iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar31 * 4);
                      *pBVar30 = *pBVar32;
                      pBVar30[1] = pBVar32[1];
                      pBVar30[2] = pBVar32[2];
                      pBVar30[3] = pBVar32[3];
                      pBVar21 = pBVar32 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar31 * 4);
                      pBVar32 = pBVar32 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table +
                                                           uVar31 * 4) - (long)iVar10);
                      *(undefined4 *)(pBVar30 + 4) = *(undefined4 *)pBVar21;
                    }
                    else {
                      *(undefined8 *)pBVar30 = *(undefined8 *)pBVar32;
                    }
                    if (8 < sVar23) {
                      pBVar21 = pBVar32 + 8;
                      pBVar20 = pBVar30 + 8;
                      if ((long)pBVar20 - (long)pBVar21 < 0x10) {
                        do {
                          *(undefined8 *)pBVar20 = *(undefined8 *)pBVar21;
                          pBVar20 = pBVar20 + 8;
                          pBVar21 = pBVar21 + 8;
                        } while (pBVar20 < pBVar30 + sVar23);
                      }
                      else {
                        uVar7 = *(undefined8 *)(pBVar32 + 0x10);
                        *(undefined8 *)pBVar20 = *(undefined8 *)pBVar21;
                        *(undefined8 *)(pBVar30 + 0x10) = uVar7;
                        if (0x18 < (long)sVar23) {
                          lVar19 = 0;
                          do {
                            uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 0x18 + 8);
                            pBVar21 = pBVar30 + lVar19 + 0x18;
                            *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar32 + lVar19 + 0x18);
                            *(undefined8 *)(pBVar21 + 8) = uVar7;
                            uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 0x28 + 8);
                            *(undefined8 *)(pBVar21 + 0x10) =
                                 *(undefined8 *)(pBVar32 + lVar19 + 0x28);
                            *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                            lVar19 = lVar19 + 0x20;
                          } while (pBVar21 + 0x20 < pBVar30 + sVar23);
                        }
                      }
                    }
                  }
                  else {
                    uVar7 = *(undefined8 *)(pBVar32 + 8);
                    *(undefined8 *)pBVar30 = *(undefined8 *)pBVar32;
                    *(undefined8 *)(pBVar30 + 8) = uVar7;
                    if (0x10 < (long)sVar23) {
                      lVar19 = 0x10;
                      do {
                        uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 8);
                        pBVar21 = pBVar30 + lVar19;
                        *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar32 + lVar19);
                        *(undefined8 *)(pBVar21 + 8) = uVar7;
                        uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 0x10 + 8);
                        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar32 + lVar19 + 0x10);
                        *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                        lVar19 = lVar19 + 0x20;
                      } while (pBVar21 + 0x20 < pBVar30 + sVar23);
                    }
                  }
                }
              }
              if (0xffffffffffffff88 < uVar13) {
                return uVar13;
              }
              uVar22 = local_130 + local_1c8 + local_110;
              *puVar29 = local_1c8;
              (&local_f0)[uVar14 * 3] = local_110;
              local_e8[uVar14 * 3] = uVar26;
              pBVar24 = pBVar24 + uVar13;
              uVar14 = (ulong)(uVar27 + 1);
              uVar26 = (ulong)local_1a8.bitsConsumed;
            }
            if ((int)local_fc <= (int)uVar27) {
LAB_007166f8:
              uVar27 = uVar27 - local_1ac;
              if ((int)uVar27 < (int)local_fc) {
                do {
                  uVar22 = (ulong)(uVar27 & 7);
                  uVar26 = (&local_f8)[uVar22 * 3];
                  pBVar21 = local_1b8 + uVar26;
                  if (litLimit < pBVar21) {
LAB_0071687c:
                    sequence_00.matchLength._0_4_ = (int)(&local_f0)[uVar22 * 3];
                    sequence_00.litLength = (&local_f8)[uVar22 * 3];
                    sequence_00.matchLength._4_4_ = (int)((&local_f0)[uVar22 * 3] >> 0x20);
                    sequence_00.offset = local_e8[uVar22 * 3];
                    uVar14 = ZSTD_execSequenceEnd
                                       (pBVar24,oend,sequence_00,&local_1b8,litLimit,pBVar6,
                                        local_120,local_138);
                  }
                  else {
                    sVar23 = (&local_f0)[uVar22 * 3];
                    uVar14 = uVar26 + sVar23;
                    if (local_118 < pBVar24 + uVar14) goto LAB_0071687c;
                    uVar22 = local_e8[uVar22 * 3];
                    pBVar30 = pBVar24 + uVar26;
                    uVar7 = *(undefined8 *)(local_1b8 + 8);
                    *(undefined8 *)pBVar24 = *(undefined8 *)local_1b8;
                    *(undefined8 *)(pBVar24 + 8) = uVar7;
                    if (0x10 < uVar26) {
                      ZSTD_decompressBlock_internal_cold_2();
                    }
                    pBVar32 = pBVar30 + -uVar22;
                    local_1b8 = pBVar21;
                    if ((ulong)((long)pBVar30 - (long)pBVar6) < uVar22) {
                      if ((ulong)((long)pBVar30 - (long)local_120) < uVar22) goto LAB_00715b07;
                      lVar19 = (long)pBVar32 - (long)pBVar6;
                      pBVar21 = local_138 + lVar19;
                      local_130 = uVar14;
                      if (local_138 < pBVar21 + sVar23) {
                        memmove(pBVar30,pBVar21,-lVar19);
                        pBVar30 = pBVar30 + -lVar19;
                        sVar23 = sVar23 + lVar19;
                        pBVar32 = pBVar6;
                        uVar14 = local_130;
                        goto LAB_007167f9;
                      }
                      memmove(pBVar30,pBVar21,sVar23);
                      uVar14 = local_130;
                    }
                    else {
LAB_007167f9:
                      if (uVar22 < 0x10) {
                        if (uVar22 < 8) {
                          iVar10 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar22 * 4);
                          *pBVar30 = *pBVar32;
                          pBVar30[1] = pBVar32[1];
                          pBVar30[2] = pBVar32[2];
                          pBVar30[3] = pBVar32[3];
                          pBVar21 = pBVar32 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar22 * 4);
                          pBVar32 = pBVar32 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table +
                                                               uVar22 * 4) - (long)iVar10);
                          *(undefined4 *)(pBVar30 + 4) = *(undefined4 *)pBVar21;
                        }
                        else {
                          *(undefined8 *)pBVar30 = *(undefined8 *)pBVar32;
                        }
                        if (8 < sVar23) {
                          pBVar21 = pBVar32 + 8;
                          pBVar20 = pBVar30 + 8;
                          if ((long)pBVar20 - (long)pBVar21 < 0x10) {
                            do {
                              *(undefined8 *)pBVar20 = *(undefined8 *)pBVar21;
                              pBVar20 = pBVar20 + 8;
                              pBVar21 = pBVar21 + 8;
                            } while (pBVar20 < pBVar30 + sVar23);
                          }
                          else {
                            uVar7 = *(undefined8 *)(pBVar32 + 0x10);
                            *(undefined8 *)pBVar20 = *(undefined8 *)pBVar21;
                            *(undefined8 *)(pBVar30 + 0x10) = uVar7;
                            if (0x18 < (long)sVar23) {
                              lVar19 = 0;
                              do {
                                uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 0x18 + 8);
                                pBVar21 = pBVar30 + lVar19 + 0x18;
                                *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar32 + lVar19 + 0x18);
                                *(undefined8 *)(pBVar21 + 8) = uVar7;
                                uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 0x28 + 8);
                                *(undefined8 *)(pBVar21 + 0x10) =
                                     *(undefined8 *)(pBVar32 + lVar19 + 0x28);
                                *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                                lVar19 = lVar19 + 0x20;
                              } while (pBVar21 + 0x20 < pBVar30 + sVar23);
                            }
                          }
                        }
                      }
                      else {
                        uVar7 = *(undefined8 *)(pBVar32 + 8);
                        *(undefined8 *)pBVar30 = *(undefined8 *)pBVar32;
                        *(undefined8 *)(pBVar30 + 8) = uVar7;
                        if (0x10 < (long)sVar23) {
                          lVar19 = 0x10;
                          do {
                            uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 8);
                            pBVar21 = pBVar30 + lVar19;
                            *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar32 + lVar19);
                            *(undefined8 *)(pBVar21 + 8) = uVar7;
                            uVar7 = *(undefined8 *)(pBVar32 + lVar19 + 0x10 + 8);
                            *(undefined8 *)(pBVar21 + 0x10) =
                                 *(undefined8 *)(pBVar32 + lVar19 + 0x10);
                            *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                            lVar19 = lVar19 + 0x20;
                          } while (pBVar21 + 0x20 < pBVar30 + sVar23);
                        }
                      }
                    }
                  }
                  if (0xffffffffffffff88 < uVar14) {
                    return uVar14;
                  }
                  pBVar24 = pBVar24 + uVar14;
                  uVar27 = uVar27 + 1;
                } while (uVar27 != local_fc);
              }
              lVar19 = 0;
              do {
                (local_108->entropy).rep[lVar19] = (U32)local_150[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              goto LAB_007169ee;
            }
          }
        }
      }
      else {
        local_1a8.ptr = (char *)((srcSize - 8) + (long)src);
        local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
        if (local_1a8.bitContainer >> 0x38 != 0) {
          uVar9 = 0x1f;
          bVar15 = (byte)(local_1a8.bitContainer >> 0x38);
          if (bVar15 != 0) {
            for (; bVar15 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          local_1a8.bitsConsumed = ~uVar9 + 9;
          if (sVar11 < 0xffffffffffffff89) goto LAB_00715cb8;
        }
      }
    }
LAB_00715b07:
    sVar11 = 0xffffffffffffffec;
  }
  return sVar11;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong, "");

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        RETURN_ERROR_IF(dst == NULL && nbSeq > 0, dstSize_tooSmall, "NULL not handled");

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif
    }
}